

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt.cpp
# Opt level: O3

long testCreateNewOrderSingle(int count)

{
  undefined8 uVar1;
  long lVar2;
  int iVar3;
  ClOrdID clOrdID;
  Symbol symbol;
  Side side;
  HandlInst handlInst;
  OrdType ordType;
  TransactTime transactTime;
  undefined1 local_3c8 [16];
  _Alloc_hider local_3b8;
  char local_3a8 [16];
  _Alloc_hider local_398;
  size_type local_390;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_388;
  size_t local_378;
  int local_370;
  undefined1 local_368 [16];
  _Alloc_hider local_358;
  char local_348 [16];
  _Alloc_hider local_338;
  size_type local_330;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_328;
  size_t local_318;
  int local_310;
  FieldBase local_308;
  FieldBase local_2a8;
  FieldBase local_248;
  FieldBase local_1e8;
  Message local_188 [344];
  
  gettimeofday((timeval *)local_3c8,(__timezone_ptr_t)0x0);
  uVar1 = local_3c8._0_8_;
  lVar2 = CONCAT44(local_3c8._12_4_,local_3c8._8_4_);
  if (-1 < count) {
    iVar3 = count + 1;
    do {
      local_2a8._vptr_FieldBase = (_func_int **)&local_2a8.m_string;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"ORDERID","");
      local_3c8._0_8_ = &PTR__FieldBase_0011c5f8;
      local_3c8._8_4_ = 0xb;
      local_3b8._M_p = local_3a8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_3b8,local_2a8._vptr_FieldBase,
                 (long)&((_Alloc_hider *)local_2a8._vptr_FieldBase)->_M_p + local_2a8._8_8_);
      local_398._M_p = (pointer)&local_388;
      local_390 = 0;
      local_388._M_local_buf[0] = '\0';
      local_378 = 0;
      local_370 = 0;
      local_3c8._0_8_ = &PTR__FieldBase_0011c678;
      if ((string *)local_2a8._vptr_FieldBase != &local_2a8.m_string) {
        operator_delete(local_2a8._vptr_FieldBase,(ulong)(local_2a8.m_string._M_dataplus._M_p + 1));
      }
      FIX::CharField::CharField((CharField *)&local_2a8,0x15,'1');
      local_2a8._vptr_FieldBase = (_func_int **)&PTR__FieldBase_0011c6b0;
      local_308._vptr_FieldBase = (_func_int **)&local_308.m_string;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_308,"LNUX","");
      local_368._0_8_ = &PTR__FieldBase_0011c5f8;
      local_368._8_4_ = 0x37;
      local_358._M_p = local_348;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_358,local_308._vptr_FieldBase,
                 (long)&((_Alloc_hider *)local_308._vptr_FieldBase)->_M_p + local_308._8_8_);
      local_338._M_p = (pointer)&local_328;
      local_330 = 0;
      local_328._M_local_buf[0] = '\0';
      local_318 = 0;
      local_310 = 0;
      local_368._0_8_ = &PTR__FieldBase_0011c720;
      if ((string *)local_308._vptr_FieldBase != &local_308.m_string) {
        operator_delete(local_308._vptr_FieldBase,(ulong)(local_308.m_string._M_dataplus._M_p + 1));
      }
      FIX::CharField::CharField((CharField *)&local_308,0x36,'1');
      local_308._vptr_FieldBase = (_func_int **)&PTR__FieldBase_0011c758;
      FIX::UtcTimeStampField::UtcTimeStampField((UtcTimeStampField *)&local_1e8,0x3c,0);
      local_1e8._vptr_FieldBase = (_func_int **)&PTR__FieldBase_0011c790;
      FIX::CharField::CharField((CharField *)&local_248,0x28,'1');
      local_248._vptr_FieldBase = (_func_int **)&PTR__FieldBase_0011c848;
      FIX42::NewOrderSingle::NewOrderSingle
                ((NewOrderSingle *)local_188,(ClOrdID *)local_3c8,(HandlInst *)&local_2a8,
                 (Symbol *)local_368,(Side *)&local_308,(TransactTime *)&local_1e8,
                 (OrdType *)&local_248);
      FIX::Message::~Message(local_188);
      FIX::FieldBase::~FieldBase(&local_248);
      FIX::FieldBase::~FieldBase(&local_1e8);
      FIX::FieldBase::~FieldBase(&local_308);
      FIX::FieldBase::~FieldBase((FieldBase *)local_368);
      FIX::FieldBase::~FieldBase(&local_2a8);
      FIX::FieldBase::~FieldBase((FieldBase *)local_3c8);
      iVar3 = iVar3 + -1;
    } while (iVar3 != 0);
  }
  lVar2 = SUB168(SEXT816(lVar2) * SEXT816(-0x20c49ba5e353f7cf),8);
  gettimeofday((timeval *)local_3c8,(__timezone_ptr_t)0x0);
  return (local_3c8._0_8_ - uVar1) * 1000 +
         CONCAT44(local_3c8._12_4_,local_3c8._8_4_) / 1000 + ((lVar2 >> 7) - (lVar2 >> 0x3f));
}

Assistant:

long testCreateNewOrderSingle( int count )
{
  long start = GetTickCount();
  for ( int i = 0; i <= count; ++i )
  {
    FIX::ClOrdID clOrdID( "ORDERID" );
    FIX::HandlInst handlInst( '1' );
    FIX::Symbol symbol( "LNUX" );
    FIX::Side side( FIX::Side_BUY );
    FIX::TransactTime transactTime;
    FIX::OrdType ordType( FIX::OrdType_MARKET );
    FIX42::NewOrderSingle( clOrdID, handlInst, symbol, side, transactTime, ordType );
  }

  return GetTickCount() - start;
}